

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KangarooTwelve.c
# Opt level: O1

uint right_encode(uchar *encbuf,size_t value)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uchar uVar10;
  uint uVar11;
  size_t sVar12;
  uint uVar13;
  size_t v;
  bool bVar14;
  undefined1 auVar15 [16];
  int iVar16;
  int iVar19;
  int iVar20;
  undefined1 auVar17 [16];
  int iVar21;
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar26 [16];
  
  if (value == 0) {
    uVar11 = 0;
  }
  else {
    sVar12 = value;
    uVar13 = 0;
    do {
      uVar11 = uVar13 + 1;
      if (sVar12 < 0x100) break;
      sVar12 = sVar12 >> 8;
      bVar14 = uVar13 < 7;
      uVar13 = uVar11;
    } while (bVar14);
  }
  uVar10 = (uchar)uVar11;
  if (uVar11 != 0) {
    lVar1 = (ulong)uVar11 - 1;
    auVar17._8_4_ = (int)lVar1;
    auVar17._0_8_ = lVar1;
    auVar17._12_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar17 = auVar17 ^ _DAT_00127100;
    iVar16 = auVar17._0_4_;
    iVar19 = auVar17._4_4_;
    iVar20 = auVar17._8_4_;
    iVar21 = auVar17._12_4_;
    auVar22._0_4_ = -(uint)(iVar19 == -0x80000000);
    auVar22._4_4_ = -(uint)(iVar19 == -0x80000000);
    auVar22._8_4_ = -(uint)(iVar21 == -0x80000000);
    auVar22._12_4_ = -(uint)(iVar21 == -0x80000000);
    auVar26._4_4_ = -(uint)(iVar16 < -0x80000000);
    auVar26._0_4_ = -(uint)(iVar16 < -0x80000000);
    auVar26._8_4_ = -(uint)(iVar20 < -0x7fffffff);
    auVar26._12_4_ = -(uint)(iVar20 < -0x7fffffff);
    auVar22 = auVar22 & auVar26;
    auVar26 = pshuflw(in_XMM4,auVar22,0xe8);
    auVar23._8_4_ = 0xffffffff;
    auVar23._0_8_ = 0xffffffffffffffff;
    auVar23._12_4_ = 0xffffffff;
    auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
    if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *encbuf = (uchar)(value >> (uVar10 * '\b' - 8 & 0x3f));
    }
    auVar23 = packssdw(auVar22,auVar22);
    auVar2._8_4_ = 0xffffffff;
    auVar2._0_8_ = 0xffffffffffffffff;
    auVar2._12_4_ = 0xffffffff;
    auVar23 = packssdw(auVar23 ^ auVar2,auVar23 ^ auVar2);
    if ((auVar23._0_4_ >> 0x10 & 1) != 0) {
      encbuf[1] = (uchar)(value >> (uVar10 * '\b' - 0x10 & 0x3f));
    }
    auVar24._0_4_ = -(uint)(iVar19 == -0x80000000);
    auVar24._4_4_ = -(uint)(iVar19 == -0x80000000);
    auVar24._8_4_ = -(uint)(iVar21 == -0x80000000);
    auVar24._12_4_ = -(uint)(iVar21 == -0x80000000);
    auVar3._4_4_ = -(uint)(iVar16 < -0x7ffffffe);
    auVar3._0_4_ = -(uint)(iVar16 < -0x7ffffffe);
    auVar3._8_4_ = -(uint)(iVar20 < -0x7ffffffd);
    auVar3._12_4_ = -(uint)(iVar20 < -0x7ffffffd);
    auVar24 = auVar24 & auVar3;
    auVar26 = packssdw(auVar26,auVar24);
    auVar4._8_4_ = 0xffffffff;
    auVar4._0_8_ = 0xffffffffffffffff;
    auVar4._12_4_ = 0xffffffff;
    auVar26 = packssdw(auVar26 ^ auVar4,auVar26 ^ auVar4);
    if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      encbuf[2] = (uchar)(value >> (uVar10 * '\b' - 0x18 & 0x3f));
    }
    auVar23 = pshufhw(auVar24,auVar24,0x84);
    auVar5._8_4_ = 0xffffffff;
    auVar5._0_8_ = 0xffffffffffffffff;
    auVar5._12_4_ = 0xffffffff;
    auVar23 = packssdw(auVar23 ^ auVar5,auVar23 ^ auVar5);
    if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      encbuf[3] = (uchar)(value >> (uVar10 * '\b' - 0x20 & 0x3f));
    }
    auVar25._0_4_ = -(uint)(iVar19 == -0x80000000);
    auVar25._4_4_ = -(uint)(iVar19 == -0x80000000);
    auVar25._8_4_ = -(uint)(iVar21 == -0x80000000);
    auVar25._12_4_ = -(uint)(iVar21 == -0x80000000);
    auVar6._4_4_ = -(uint)(iVar16 < -0x7ffffffc);
    auVar6._0_4_ = -(uint)(iVar16 < -0x7ffffffc);
    auVar6._8_4_ = -(uint)(iVar20 < -0x7ffffffb);
    auVar6._12_4_ = -(uint)(iVar20 < -0x7ffffffb);
    auVar25 = auVar25 & auVar6;
    auVar26 = pshuflw(auVar26,auVar25,0xe8);
    auVar7._8_4_ = 0xffffffff;
    auVar7._0_8_ = 0xffffffffffffffff;
    auVar7._12_4_ = 0xffffffff;
    auVar26 = packssdw(auVar26 ^ auVar7,auVar26 ^ auVar7);
    if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      encbuf[4] = (uchar)(value >> (uVar10 * '\b' - 0x28 & 0x3f));
    }
    auVar26 = packssdw(auVar25,auVar25);
    auVar8._8_4_ = 0xffffffff;
    auVar8._0_8_ = 0xffffffffffffffff;
    auVar8._12_4_ = 0xffffffff;
    auVar26 = packssdw(auVar26 ^ auVar8,auVar26 ^ auVar8);
    if ((auVar26 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      encbuf[5] = (uchar)(value >> (uVar10 * '\b' - 0x30 & 0x3f));
    }
    auVar15._0_4_ = -(uint)(DAT_00127130._4_4_ == iVar19);
    auVar15._4_4_ = -(uint)(DAT_00127130._4_4_ == iVar19);
    auVar15._8_4_ = -(uint)(DAT_00127130._12_4_ == iVar21);
    auVar15._12_4_ = -(uint)(DAT_00127130._12_4_ == iVar21);
    auVar9._4_4_ = -(uint)(iVar16 < (int)DAT_00127130);
    auVar9._0_4_ = -(uint)(iVar16 < (int)DAT_00127130);
    auVar9._8_4_ = -(uint)(iVar20 < DAT_00127130._8_4_);
    auVar9._12_4_ = -(uint)(iVar20 < DAT_00127130._8_4_);
    auVar15 = auVar15 & auVar9;
    auVar26 = packssdw(_DAT_00127130,auVar15);
    auVar18._8_4_ = 0xffffffff;
    auVar18._0_8_ = 0xffffffffffffffff;
    auVar18._12_4_ = 0xffffffff;
    auVar26 = packssdw(auVar26 ^ auVar18,auVar26 ^ auVar18);
    if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      encbuf[6] = (uchar)(value >> (uVar10 * '\b' - 0x38 & 0x3f));
    }
    auVar26 = pshufhw(auVar15,auVar15,0x84);
    auVar26 = packssdw(auVar26 ^ auVar18,auVar26 ^ auVar18);
    if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      encbuf[7] = (uchar)(value >> (uVar10 * '\b' & 0x3f));
    }
  }
  encbuf[uVar11] = uVar10;
  return uVar11 + 1;
}

Assistant:

static unsigned int right_encode( unsigned char * encbuf, size_t value )
{
    unsigned int n, i;
    size_t v;

    for ( v = value, n = 0; v && (n < sizeof(size_t)); ++n, v >>= 8 )
        ; /* empty */
    for ( i = 1; i <= n; ++i )
        encbuf[i-1] = (unsigned char)(value >> (8 * (n-i)));
    encbuf[n] = (unsigned char)n;
    return n + 1;
}